

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O3

Cut_CMan_t * Cut_CManStart(void)

{
  uint *puVar1;
  Cut_CMan_t *pCVar2;
  st__table *psVar3;
  Extra_MmFixed_t *pEVar4;
  long lVar5;
  uint uVar6;
  
  pCVar2 = (Cut_CMan_t *)calloc(1,0x1440);
  psVar3 = st__init_table(st__ptrcmp,st__ptrhash);
  pCVar2->tTable = psVar3;
  pEVar4 = Extra_MmFixedStart(0x98);
  pCVar2->pMem = pEVar4;
  lVar5 = 0;
  do {
    uVar6 = 0;
    do {
      if ((uVar6 & 1 << ((byte)lVar5 & 0x1f)) != 0) {
        puVar1 = pCVar2->uInputs[lVar5] + (uVar6 >> 5);
        *puVar1 = *puVar1 | 1 << ((byte)uVar6 & 0x1f);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x200);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  s_pCMan = pCVar2;
  return pCVar2;
}

Assistant:

Cut_CMan_t * Cut_CManStart()
{
    Cut_CMan_t * p;
    int i, k;
    // start the manager
    assert( sizeof(unsigned) == 4 );
    p = ABC_ALLOC( Cut_CMan_t, 1 );
    memset( p, 0, sizeof(Cut_CMan_t) );
    // start the table and the memory manager
    p->tTable = st__init_table( st__ptrcmp, st__ptrhash);;
    p->pMem = Extra_MmFixedStart( sizeof(Cut_Cell_t) );
    // set elementary truth tables
    for ( k = 0; k < CUT_CELL_MVAR; k++ )
        for ( i = 0; i < (1<<CUT_CELL_MVAR); i++ )
            if ( i & (1 << k) )
                p->uInputs[k][i>>5] |= (1 << (i&31));
    s_pCMan = p;
    return p;
}